

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O1

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopyCheckUtf8SSE42
                 (uint8_t *dst,uint8_t *src,size_t limit)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  auVar1 = _DAT_0011d660;
  sVar4 = 0;
  while( true ) {
    if (limit < 0x10) {
      if (limit != 0) {
        iVar3 = pcmpistri(auVar1,*(undefined1 (*) [16])src,0x14);
        iVar2 = (int)limit;
        if (iVar3 < (int)limit) {
          iVar2 = iVar3;
        }
        memcpy(dst,src,(long)iVar2);
        sVar4 = sVar4 + (long)iVar2;
      }
      return sVar4;
    }
    iVar2 = pcmpistri(auVar1,*(undefined1 (*) [16])src,0x14);
    if (iVar2 < 0x10) break;
    *(undefined1 (*) [16])dst = *(undefined1 (*) [16])src;
    src = (uint8_t *)((long)src + 0x10);
    dst = (uint8_t *)((long)dst + 0x10);
    limit = limit - 0x10;
    sVar4 = sVar4 + 0x10;
  }
  memcpy(dst,src,(long)iVar2);
  return sVar4 + (long)iVar2;
}

Assistant:

std::size_t JSONStringCopyCheckUtf8SSE42(uint8_t* dst, uint8_t const* src,
                                         std::size_t limit) {
  alignas(16) static unsigned char const ranges[17] =
      "\x20\x21\x23\x5b\x5d\x7f          ";
  //= "\x01\x1f\x80\xff\"\"\\\\\"\"\"\"\"\"\"\"";
  __m128i const r = _mm_load_si128(reinterpret_cast<__m128i const*>(ranges));
  std::size_t count = 0;
  int x = 0;
  while (limit >= 16) {
    __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
    x = _mm_cmpistri(r, /* 8, */ s, /* 16, */
                     _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                         _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
    if (x < 16) {
      memcpy(dst, src, x);
      count += x;
      return count;
    }
    _mm_storeu_si128(reinterpret_cast<__m128i*>(dst), s);
    src += 16;
    dst += 16;
    limit -= 16;
    count += 16;
  }
  if (limit == 0) {
    return count;
  }
  __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
  x = _mm_cmpistri(r, /* 8, */ s, /* limit, */
                   _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                       _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
  if (x > static_cast<int>(limit)) {
    x = static_cast<int>(limit);
  }
  memcpy(dst, src, x);
  count += x;
  return count;
}